

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall
Clasp::UncoreMinimize::addCore
          (UncoreMinimize *this,Solver *s,LitPair *lits,uint32 cs,weight_t w,bool updateLower)

{
  WCTemp *this_00;
  WL WVar1;
  uint uVar2;
  weight_t weight;
  pointer pCVar3;
  WL *pWVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  LitData *x;
  ulong uVar9;
  uint uVar10;
  undefined7 in_register_00000089;
  uint uVar11;
  ulong uVar12;
  LitPair local_58;
  LitSet *local_50;
  ulong local_48;
  LitData *local_40;
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000089,updateLower) != 0) {
    this->lower_ = this->lower_ + (long)w;
  }
  if (cs != 0) {
    local_50 = &this->assume_;
    this_00 = &this->temp_;
    uVar9 = (ulong)cs;
    uVar12 = 0;
    local_48 = uVar9;
    do {
      x = (this->litData_).ebo_.buf + (lits[uVar12].id - 1);
      iVar7 = x->weight;
      x->weight = x->weight - w;
      if (x->weight == 0 || SBORROW4(iVar7,w) != x->weight < 0) {
        uVar6 = *(uint *)&x->field_0x4 & 0xbfffffff;
        *(uint *)&x->field_0x4 = uVar6;
        x->weight = 0;
LAB_001537b8:
        uVar6 = uVar6 & 0x3fffffff;
        if (uVar6 != 0) {
          pCVar3 = (this->open_).ebo_.buf;
          iVar7 = pCVar3[(ulong)uVar6 - 1].bound + 1;
          (this->temp_).lits.ebo_.size = 0;
          (this->temp_).bound = iVar7;
          uVar11 = (uint)*(pCVar3[(ulong)uVar6 - 1].con)->lits_ & 0x3fffffff;
          local_38 = uVar12;
          if (uVar11 != 1) {
            iVar7 = 0;
            local_40 = x;
            do {
              iVar7 = iVar7 + 1;
              pWVar4 = (pCVar3[(ulong)uVar6 - 1].con)->lits_;
              WVar1 = pWVar4[(ulong)(uint)(iVar7 << (SUB41(*pWVar4,3) >> 7)) + 1];
              uVar8 = *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                               (ulong)((uint)WVar1 & 0xfffffffc));
              if ((uVar8 & 3) != 0 && 0xf < uVar8) {
                uVar10 = (s->levels_).root;
                while (uVar2 = this->eRoot_, uVar2 < uVar10) {
                  uVar8 = (uVar8 >> 4) - 1;
                  if (uVar8 <= uVar2) {
                    uVar8 = uVar2;
                  }
                  Solver::popRootLevel(s,uVar10 - uVar8,(LitVec *)0x0,true);
                  uVar10 = (s->levels_).root;
                  uVar8 = this->aTop_;
                  if (uVar10 < this->aTop_) {
                    uVar8 = uVar10;
                  }
                  this->aTop_ = uVar8;
                  uVar8 = (s->assign_).assign_.ebo_.buf[(uint)WVar1 >> 2];
                  if ((uVar8 < 0x10) || ((uVar8 & 3) == 0)) break;
                }
              }
              WCTemp::add(this_00,s,(Literal)((uint)WVar1 & 0xfffffffe));
            } while (iVar7 != uVar11 - 1);
            iVar7 = this_00->bound;
            x = local_40;
          }
          weight = pCVar3[(ulong)uVar6 - 1].weight;
          bVar5 = closeCore(this,s,x,iVar7 < 2);
          if ((!bVar5) ||
             (bVar5 = addOllCon(this,s,this_00,weight), uVar9 = local_48, uVar12 = local_38, !bVar5)
             ) {
            return false;
          }
        }
      }
      else if (((this->field_0xef & 0x20) != 0) && ((*(uint *)&x->field_0x4 >> 0x1e & 1) == 0)) {
        *(uint *)&x->field_0x4 = *(uint *)&x->field_0x4 | 0x40000000;
        local_58.id = lits[uVar12].id;
        local_58.lit.rep_ = lits[uVar12].lit.rep_ & 0xfffffffe ^ 2;
        bk_lib::
        pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
        ::push_back(local_50,&local_58);
        if (x->weight == 0) {
          uVar6 = *(uint *)&x->field_0x4;
          goto LAB_001537b8;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar9);
    if (cs == 1) {
      bVar5 = fixLit(this,s,(Literal)(lits->lit).rep_);
      return bVar5;
    }
  }
  switch((uint)this->options_ >> 3 & 3) {
  case 0:
    bVar5 = addOll(this,s,lits,cs,w);
    return bVar5;
  case 1:
    uVar6 = cs;
    break;
  case 2:
    uVar6 = (uint)this->options_ >> 0x11;
    break;
  case 3:
    bVar5 = addPmr(this,s,lits,cs,w);
    return bVar5;
  }
  bVar5 = addK(this,s,uVar6,lits,cs,w);
  return bVar5;
}

Assistant:

bool UncoreMinimize::addCore(Solver& s, const LitPair* lits, uint32 cs, weight_t w, bool updateLower) {
	assert(s.decisionLevel() == s.rootLevel());
	assert(w && cs);
	// apply weight and check for subcores
	if (updateLower) { lower_ += w; }
	for (uint32 i = 0; i != cs; ++i) {
		LitData& x = getData(lits[i].id);
		if ( (x.weight -= w) <= 0) {
			x.assume = 0;
			x.weight = 0;
		}
		else if (disj_ && !x.assume) {
			x.assume = 1;
			assume_.push_back(LitPair(~lits[i].lit, lits[i].id));
		}
		if (x.weight == 0 && hasCore(x)) {
			Core& core = getCore(x);
			temp_.start(core.bound + 1);
			for (uint32 k = 0, end = core.size(); k != end; ++k) {
				Literal p = core.at(k);
				while (s.topValue(p.var()) != s.value(p.var()) && s.rootLevel() > eRoot_) {
					s.popRootLevel(s.rootLevel() - std::max(s.level(p.var())-1, eRoot_));
					aTop_ = std::min(aTop_, s.rootLevel());
				}
				temp_.add(s, p);
			}
			weight_t cw = core.weight;
			if (!closeCore(s, x, temp_.bound <= 1) || !addOllCon(s, temp_, cw)) {
				return false;
			}
		}
	}
	if (cs == 1) {
		return fixLit(s, lits[0].lit);
	}
	// add new core
	switch (options_.algo) {
		default:
		case OptParams::usc_oll: return addOll(s, lits, cs, w);
		case OptParams::usc_one: return addK(s, cs, lits, cs, w);
		case OptParams::usc_k:   return addK(s, options_.kLim, lits, cs, w);
		case OptParams::usc_pmr: return addPmr(s, lits, cs, w);
	}
}